

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeSTRPreReg(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t Val;
  DecodeStatus DVar5;
  uint imm;
  uint Rt;
  uint Rn;
  uint pred;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  Rn = 3;
  _pred = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Insn,0x10,4);
  RegNo_00 = fieldFromInstruction_4(Address_local._4_4_,0xc,4);
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,0,0xc);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0x10,4);
  uVar4 = fieldFromInstruction_4(Address_local._4_4_,0x17,1);
  Val = fieldFromInstruction_4(Address_local._4_4_,0x1c,4);
  if ((RegNo == 0xf) || (RegNo == RegNo_00)) {
    Rn = 1;
  }
  DVar5 = DecodeGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_pred);
  _Var1 = Check(&Rn,DVar5);
  if (_Var1) {
    DVar5 = DecodeGPRRegisterClass(pMStack_18,RegNo_00,(uint64_t)Decoder_local,_pred);
    _Var1 = Check(&Rn,DVar5);
    if (_Var1) {
      DVar5 = DecodeSORegMemOperand
                        (pMStack_18,uVar4 << 0xc | uVar3 << 0xd | uVar2,(uint64_t)Decoder_local,
                         _pred);
      _Var1 = Check(&Rn,DVar5);
      if (_Var1) {
        DVar5 = DecodePredicateOperand(pMStack_18,Val,(uint64_t)Decoder_local,_pred);
        _Var1 = Check(&Rn,DVar5);
        if (_Var1) {
          Inst_local._4_4_ = Rn;
        }
        else {
          Inst_local._4_4_ = MCDisassembler_Fail;
        }
      }
      else {
        Inst_local._4_4_ = MCDisassembler_Fail;
      }
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeSTRPreReg(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned pred;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 12);
	imm |= fieldFromInstruction_4(Insn, 16, 4) << 13;
	imm |= fieldFromInstruction_4(Insn, 23, 1) << 12;
	pred = fieldFromInstruction_4(Insn, 28, 4);

	if (Rn == 0xF || Rn == Rt) S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeSORegMemOperand(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}